

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_warp.c
# Opt level: O0

int fe_warp_set(melfb_t *mel,char *id_name)

{
  int iVar1;
  uint local_24;
  uint32 i;
  char *id_name_local;
  melfb_t *mel_local;
  
  for (local_24 = 0; name2id[local_24] != (char *)0x0; local_24 = local_24 + 1) {
    iVar1 = strcmp(id_name,name2id[local_24]);
    if (iVar1 == 0) {
      mel->warp_id = local_24;
      break;
    }
  }
  if (name2id[local_24] == (char *)0x0) {
    for (local_24 = 0; __name2id[local_24] != (char *)0x0; local_24 = local_24 + 1) {
      iVar1 = strcmp(id_name,__name2id[local_24]);
      if (iVar1 == 0) {
        mel->warp_id = local_24;
        break;
      }
    }
    if (__name2id[local_24] == (char *)0x0) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_warp.c"
              ,0x78,"Unimplemented warping function %s\n",id_name);
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_warp.c"
              ,0x79,"Implemented functions are:\n");
      for (local_24 = 0; name2id[local_24] != (char *)0x0; local_24 = local_24 + 1) {
        fprintf(_stderr,"\t%s\n",name2id[local_24]);
      }
      mel->warp_id = 0xffffffff;
      return -2;
    }
  }
  return 0;
}

Assistant:

int
fe_warp_set(melfb_t *mel, const char *id_name)
{
    uint32 i;

    for (i = 0; name2id[i]; i++) {
        if (strcmp(id_name, name2id[i]) == 0) {
            mel->warp_id = i;
            break;
        }
    }

    if (name2id[i] == NULL) {
        for (i = 0; __name2id[i]; i++) {
            if (strcmp(id_name, __name2id[i]) == 0) {
                mel->warp_id = i;
                break;
            }
        }
        if (__name2id[i] == NULL) {
            E_ERROR("Unimplemented warping function %s\n", id_name);
            E_ERROR("Implemented functions are:\n");
            for (i = 0; name2id[i]; i++) {
                fprintf(stderr, "\t%s\n", name2id[i]);
            }
            mel->warp_id = FE_WARP_ID_NONE;

            return FE_START_ERROR;
        }
    }

    return FE_SUCCESS;
}